

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O0

Real amrex::MultiFab::Dot
               (iMultiFab *mask,MultiFab *x,int xcomp,MultiFab *y,int ycomp,int numcomp,int nghost,
               bool local)

{
  bool bVar1;
  int in_EDX;
  int in_R8D;
  int in_R9D;
  byte in_stack_00000010;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_int> *mfab;
  Array4<const_double> *yfab;
  Array4<const_double> *xfab;
  Box *bx;
  MFIter mfi;
  Real sm;
  int *in_stack_fffffffffffffcf8;
  MFIter *in_stack_fffffffffffffd00;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffd08;
  int local_2e0;
  undefined4 in_stack_fffffffffffffd24;
  int iVar2;
  undefined4 in_stack_fffffffffffffd28;
  int iVar3;
  undefined4 in_stack_fffffffffffffd2c;
  int iVar4;
  MFIter *in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd6c;
  MFIter *in_stack_fffffffffffffd70;
  long local_288;
  long local_280;
  int local_270;
  int local_26c;
  int local_268;
  undefined1 local_248 [136];
  MFIter *local_1c0;
  int local_1b4 [7];
  int *local_198;
  MFIter local_190;
  pointer local_130;
  byte local_121;
  int local_120;
  int local_11c;
  int local_10c;
  ShMem local_f8;
  int local_dc;
  int iStack_d8;
  int local_d4;
  _Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false> local_d0;
  int local_c8;
  int *local_c0;
  int local_b4;
  int iStack_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  FabArray<amrex::FArrayBox> *local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  MFIter *local_80;
  int local_74;
  int local_70;
  int local_6c;
  undefined1 *local_68;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  int *local_48;
  undefined4 local_3c;
  _Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false> *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_121 = in_stack_00000010 & 1;
  local_130 = (pointer)0x0;
  local_120 = in_R9D;
  local_11c = in_R8D;
  local_10c = in_EDX;
  MFIter::MFIter(in_stack_fffffffffffffd30,
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                 SUB41((uint)in_stack_fffffffffffffd24 >> 0x18,0));
  while (bVar1 = MFIter::isValid(&local_190), bVar1) {
    in_stack_fffffffffffffcf8 = local_1b4;
    MFIter::growntilebox(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    in_stack_fffffffffffffd00 = (MFIter *)(local_248 + 0x48);
    local_198 = in_stack_fffffffffffffcf8;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    in_stack_fffffffffffffd08 = (FabArray<amrex::FArrayBox> *)local_248;
    local_1c0 = in_stack_fffffffffffffd00;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    local_248._64_8_ = in_stack_fffffffffffffd08;
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
              ((FabArray<amrex::IArrayBox> *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    local_f8.n_points = (Long)local_198;
    local_8 = local_198;
    local_c = 0;
    local_dc = *local_198;
    local_18 = local_198;
    local_1c = 1;
    iStack_d8 = local_198[1];
    local_f8._0_8_ = *(undefined8 *)local_198;
    local_28 = local_198;
    local_2c = 2;
    local_f8.n_values._0_4_ = local_198[2];
    local_c0 = local_198;
    local_38 = (_Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false> *)(local_198 + 3);
    local_3c = 0;
    local_b4 = *(int *)&local_38->_M_head_impl;
    local_48 = local_198 + 3;
    local_4c = 1;
    iStack_b0 = local_198[4];
    local_d0._M_head_impl = local_38->_M_head_impl;
    local_58 = local_198 + 3;
    local_5c = 2;
    local_c8 = local_198[5];
    for (iVar4 = 0; iVar3 = (int)local_f8.n_values, iVar4 < local_120; iVar4 = iVar4 + 1) {
      for (; iVar2 = iStack_d8, iVar3 <= local_c8; iVar3 = iVar3 + 1) {
        for (; local_2e0 = local_dc, iVar2 <= iStack_b0; iVar2 = iVar2 + 1) {
          for (; local_2e0 <= local_b4; local_2e0 = local_2e0 + 1) {
            local_6c = local_2e0;
            if ((in_stack_fffffffffffffd70->tile_size).vect
                [(long)(local_2e0 - local_270) + (iVar2 - local_26c) * local_288 +
                 (iVar3 - local_268) * local_280 + -4] != 0) {
              local_90 = local_10c + iVar4;
              local_80 = local_1c0;
              local_84 = local_2e0;
              local_a8 = local_11c + iVar4;
              local_98 = (FabArray<amrex::FArrayBox> *)local_248._64_8_;
              local_9c = local_2e0;
              local_130 = (pointer)((double)(&((local_1c0->m_fa)._M_t.
                                               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                              _M_head_impl)->_vptr_FabArrayBase)
                                            [(long)(local_2e0 - local_1c0->currentIndex) +
                                             (long)(iVar2 - local_1c0->beginIndex) *
                                             (long)local_1c0->fabArray +
                                             (long)(iVar3 - local_1c0->endIndex) *
                                             *(long *)(local_1c0->tile_size).vect +
                                             (long)local_90 *
                                             *(long *)((local_1c0->tile_size).vect + 2)] *
                                    *(double *)
                                     (*(long *)local_248._64_8_ +
                                     ((long)(local_2e0 - *(int *)(local_248._64_8_ + 0x20)) +
                                      (long)(iVar2 - *(int *)(local_248._64_8_ + 0x24)) *
                                      *(long *)&((BoxArray *)(local_248._64_8_ + 8))->m_bat +
                                      (long)(iVar3 - *(int *)(local_248._64_8_ + 0x28)) *
                                      *(long *)(local_248._64_8_ + 0x10) +
                                     (long)local_a8 * *(long *)(local_248._64_8_ + 0x18)) * 8) +
                                   (double)local_130);
              local_a4 = iVar3;
              local_a0 = iVar2;
              local_8c = iVar3;
              local_88 = iVar2;
            }
            local_74 = iVar3;
            local_70 = iVar2;
            local_68 = &stack0xfffffffffffffd70;
          }
        }
      }
    }
    local_d4 = (int)local_f8.n_values;
    local_ac = local_c8;
    MFIter::operator++(&local_190);
  }
  MFIter::~MFIter(in_stack_fffffffffffffd00);
  if ((local_121 & 1) == 0) {
    ParallelContext::CommunicatorSub();
    ParallelAllReduce::Sum<double>
              ((double *)in_stack_fffffffffffffd00,
               (MPI_Comm)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  }
  return (Real)local_130;
}

Assistant:

Real
MultiFab::Dot (const iMultiFab& mask,
               const MultiFab& x, int xcomp,
               const MultiFab& y, int ycomp,
               int numcomp, int nghost, bool local)
{
    BL_ASSERT(x.boxArray() == y.boxArray());
    BL_ASSERT(x.boxArray() == mask.boxArray());
    BL_ASSERT(x.DistributionMap() == y.DistributionMap());
    BL_ASSERT(x.DistributionMap() == mask.DistributionMap());
    BL_ASSERT(x.nGrow() >= nghost && y.nGrow() >= nghost);
    BL_ASSERT(mask.nGrow() >= nghost);

    Real sm = Real(0.0);
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& xma = x.const_arrays();
        auto const& yma = y.const_arrays();
        auto const& mma = mask.const_arrays();
        sm = ParReduce(TypeList<ReduceOpSum>{}, TypeList<Real>{}, x, IntVect(nghost),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
        {
            Real t = Real(0.0);
            if (mma[box_no](i,j,k)) {
                auto const& xfab = xma[box_no];
                auto const& yfab = yma[box_no];
                for (int n = 0; n < numcomp; ++n) {
                    t += xfab(i,j,k,xcomp+n) * yfab(i,j,k,ycomp+n);
                }
            }
            return t;
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!system::regtest_reduction) reduction(+:sm)
#endif
        for (MFIter mfi(x,true); mfi.isValid(); ++mfi)
        {
            Box const& bx = mfi.growntilebox(nghost);
            Array4<Real const> const& xfab = x.const_array(mfi);
            Array4<Real const> const& yfab = y.const_array(mfi);
            Array4<int const> const& mfab = mask.const_array(mfi);
            AMREX_LOOP_4D(bx, numcomp, i, j, k, n,
            {
                if (mfab(i,j,k)) {
                    sm += xfab(i,j,k,xcomp+n) * yfab(i,j,k,ycomp+n);
                }
            });
        }
    }

    if (!local) {
        ParallelAllReduce::Sum(sm, ParallelContext::CommunicatorSub());
    }

    return sm;
}